

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

MDD lddmc_makenode(uint32_t value,MDD ifeq,MDD ifneq)

{
  long *plVar1;
  uint64_t a;
  uint64_t b;
  MDD MVar2;
  llmsset_t plVar3;
  long in_FS_OFFSET;
  mddnode n;
  int created;
  undefined1 auStack_c0 [64];
  code *pcStack_80;
  int6 local_78;
  undefined4 uStack_72;
  undefined6 uStack_6e;
  int local_64;
  Task local_60;
  
  MVar2 = ifneq;
  if (ifeq != 0) {
    uStack_72._2_2_ = (undefined2)(value >> 0x10);
    if (ifneq == 0) {
      local_78 = 0;
      uStack_6e = (undefined6)((ifeq << 0x11) >> 0x10);
    }
    else {
      if (ifneq == 1) {
        pcStack_80 = (code *)0x107dae;
        __assert_fail("ifneq != lddmc_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x166,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
      if (*(uint *)(nodes->data + ifneq * 0x10 + 6) <= value) {
        pcStack_80 = (code *)0x107dcd;
        __assert_fail("value < mddnode_getvalue(LDD_GETNODE(ifneq))",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x167,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
      local_78 = (int6)ifneq * 2;
      uStack_6e = (undefined6)((ifeq << 0x11) >> 0x10);
    }
    uStack_72._0_2_ = (undefined2)value;
    a = CONCAT26((undefined2)uStack_72,local_78);
    b = CONCAT62(uStack_6e,uStack_72._2_2_);
    pcStack_80 = (code *)0x107d1f;
    uStack_72 = value;
    MVar2 = llmsset_lookup(nodes,a,b,&local_64);
    if (MVar2 == 0) {
      pcStack_80 = (code *)0x107d2c;
      lddmc_refs_push(ifeq);
      pcStack_80 = (code *)0x107d34;
      lddmc_refs_push(ifneq);
      local_60.f = sylvan_gc_WRAP;
      local_60.thief = (_Worker *)0x1;
      pcStack_80 = (code *)0x107d50;
      lace_run_task(&local_60);
      plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28);
      *plVar1 = *plVar1 + -8;
      pcStack_80 = (code *)0x107d78;
      plVar3 = nodes;
      MVar2 = llmsset_lookup(nodes,a,b,&local_64);
      if (MVar2 == 0) {
        pcStack_80 = llmsset_count_marked_RUN;
        lddmc_makenode_cold_1();
        auStack_c0._0_8_ = llmsset_count_marked_WRAP;
        auStack_c0._8_8_ = (_Worker *)0x1;
        auStack_c0._16_8_ = plVar3;
        pcStack_80 = (code *)ifneq;
        lace_run_task((Task *)auStack_c0);
        return (MDD)(llmsset_t)auStack_c0._16_8_;
      }
    }
  }
  return MVar2;
}

Assistant:

MDD
lddmc_makenode(uint32_t value, MDD ifeq, MDD ifneq)
{
    if (ifeq == lddmc_false) return ifneq;

    // check if correct (should be false, or next in value)
    assert(ifneq != lddmc_true);
    if (ifneq != lddmc_false) assert(value < mddnode_getvalue(LDD_GETNODE(ifneq)));

    struct mddnode n;
    mddnode_make(&n, value, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}